

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

int x25519_ge_frombytes_vartime(ge_p3 *h,uint8_t *s)

{
  int iVar1;
  undefined1 local_110 [8];
  fe_loose t;
  fe_loose check;
  fe vxx;
  fe w;
  fe_loose v;
  fe u;
  uint8_t *s_local;
  ge_p3 *h_local;
  
  fe_frombytes(&h->Y,s);
  fe_1(&h->Z);
  fe_sq_tt((fe *)(vxx.v + 4),&h->Y);
  fe_mul_ttt((fe *)(check.v + 4),(fe *)(vxx.v + 4),&d);
  fe_sub((fe_loose *)(w.v + 4),(fe *)(vxx.v + 4),&h->Z);
  fe_carry((fe *)(v.v + 4),(fe_loose *)(w.v + 4));
  fe_add((fe_loose *)(w.v + 4),(fe *)(check.v + 4),&h->Z);
  fe_mul_ttl((fe *)(vxx.v + 4),(fe *)(v.v + 4),(fe_loose *)(w.v + 4));
  fe_pow22523(&h->X,(fe *)(vxx.v + 4));
  fe_mul_ttt(&h->X,&h->X,(fe *)(v.v + 4));
  fe_sq_tt((fe *)(check.v + 4),&h->X);
  fe_mul_ttl((fe *)(check.v + 4),(fe *)(check.v + 4),(fe_loose *)(w.v + 4));
  fe_sub((fe_loose *)(t.v + 4),(fe *)(check.v + 4),(fe *)(v.v + 4));
  iVar1 = fe_isnonzero((fe_loose *)(t.v + 4));
  if (iVar1 != 0) {
    fe_add((fe_loose *)(t.v + 4),(fe *)(check.v + 4),(fe *)(v.v + 4));
    iVar1 = fe_isnonzero((fe_loose *)(t.v + 4));
    if (iVar1 != 0) {
      return 0;
    }
    fe_mul_ttt(&h->X,&h->X,&sqrtm1);
  }
  iVar1 = fe_isnegative(&h->X);
  if (iVar1 != (int)(uint)s[0x1f] >> 7) {
    fe_neg((fe_loose *)local_110,&h->X);
    fe_carry(&h->X,(fe_loose *)local_110);
  }
  fe_mul_ttt(&h->T,&h->X,&h->Y);
  return 1;
}

Assistant:

int x25519_ge_frombytes_vartime(ge_p3 *h, const uint8_t s[32]) {
  fe u;
  fe_loose v;
  fe w;
  fe vxx;
  fe_loose check;

  fe_frombytes(&h->Y, s);
  fe_1(&h->Z);
  fe_sq_tt(&w, &h->Y);
  fe_mul_ttt(&vxx, &w, &d);
  fe_sub(&v, &w, &h->Z);  // u = y^2-1
  fe_carry(&u, &v);
  fe_add(&v, &vxx, &h->Z);  // v = dy^2+1

  fe_mul_ttl(&w, &u, &v);        // w = u*v
  fe_pow22523(&h->X, &w);        // x = w^((q-5)/8)
  fe_mul_ttt(&h->X, &h->X, &u);  // x = u*w^((q-5)/8)

  fe_sq_tt(&vxx, &h->X);
  fe_mul_ttl(&vxx, &vxx, &v);
  fe_sub(&check, &vxx, &u);
  if (fe_isnonzero(&check)) {
    fe_add(&check, &vxx, &u);
    if (fe_isnonzero(&check)) {
      return 0;
    }
    fe_mul_ttt(&h->X, &h->X, &sqrtm1);
  }

  if (fe_isnegative(&h->X) != (s[31] >> 7)) {
    fe_loose t;
    fe_neg(&t, &h->X);
    fe_carry(&h->X, &t);
  }

  fe_mul_ttt(&h->T, &h->X, &h->Y);
  return 1;
}